

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state_tests.cc
# Opt level: O0

int __thiscall hwtest::pgraph::StateTest::run_once(StateTest *this)

{
  int iVar1;
  bool fail;
  StateTest *this_local;
  
  this->skip = false;
  pgraph_gen_state((this->super_RepeatTest).super_Test.cnum,&(this->super_RepeatTest).super_Test.rnd
                   ,&this->orig);
  (*(this->super_RepeatTest).super_Test._vptr_Test[9])();
  pgraph_load_state((this->super_RepeatTest).super_Test.cnum,&this->orig);
  memcpy(&this->exp,&this->orig,0xc1a0);
  (*(this->super_RepeatTest).super_Test._vptr_Test[10])();
  pgraph_calc_state(&this->exp);
  (this->real).celsius_pipe_broke_ovtx = (bool)((this->orig).celsius_pipe_broke_ovtx & 1);
  pgraph_dump_state((this->super_RepeatTest).super_Test.cnum,&this->real);
  iVar1 = (*(this->super_RepeatTest).super_Test._vptr_Test[0xb])();
  if ((this->skip & 1U) == 0) {
    iVar1 = pgraph_cmp_state(&this->orig,&this->exp,&this->real,(bool)((byte)iVar1 & 1));
    if (iVar1 == 0) {
      this_local._4_4_ = 1;
    }
    else {
      (*(this->super_RepeatTest).super_Test._vptr_Test[0xc])();
      this_local._4_4_ = 3;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int StateTest::run_once() {
	skip = false;
	pgraph_gen_state(cnum, rnd, &orig);
	adjust_orig();
	pgraph_load_state(cnum, &orig);
	exp = orig;
	mutate();
	pgraph_calc_state(&exp);
	real.celsius_pipe_broke_ovtx = orig.celsius_pipe_broke_ovtx;
	pgraph_dump_state(cnum, &real);
	bool fail = other_fail();
	if (skip)
		return HWTEST_RES_NA;
	if (pgraph_cmp_state(&orig, &exp, &real, fail)) {
		print_fail();
		return HWTEST_RES_FAIL;
	}
	return HWTEST_RES_PASS;
}